

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O3

void __thiscall TxRequestTracker::Impl::PostGetRequestableSanityCheck(Impl *this,microseconds now)

{
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar1;
  pointer poVar2;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  poVar1 = (this->m_index).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
           .member;
  poVar2 = (poVar1->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.left_;
  poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
            *)&poVar2[-5].
               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .super_type.right_;
  if (poVar2 == (pointer)0x0) {
    poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
              *)0x0;
  }
  do {
    if (poVar3 == poVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
        __stack_chk_fail();
      }
      return;
    }
    uVar4 = *(ulong *)((long)&(poVar3->
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                              ).
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                              .
                              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                              data_ + 0x30) >> 0x3d;
    if (uVar4 == 0 || uVar4 == 3) {
      if (*(long *)((long)&(poVar3->
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                           ).
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                           .
                           super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                           .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                   + 0x20) <= now.__r) {
        __assert_fail("ann.m_time > now",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txrequest.cpp"
                      ,0x16d,
                      "void TxRequestTracker::Impl::PostGetRequestableSanityCheck(std::chrono::microseconds) const"
                     );
      }
    }
    else if ((uVar4 - 1 < 2) &&
            (now.__r < *(long *)((long)&(poVar3->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                        ).
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        .
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x20))) {
      __assert_fail("ann.m_time <= now",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txrequest.cpp"
                    ,0x171,
                    "void TxRequestTracker::Impl::PostGetRequestableSanityCheck(std::chrono::microseconds) const"
                   );
    }
    local_28 = &poVar3->
                super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
    ;
    boost::multi_index::detail::
    ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
    ::increment((pointer *)&local_28);
    poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
              *)((long)(local_28 + -5) + 0x10);
    if (local_28 ==
        (ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
         *)0x0) {
      poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                *)0x0;
    }
  } while( true );
}

Assistant:

void PostGetRequestableSanityCheck(std::chrono::microseconds now) const
    {
        for (const Announcement& ann : m_index) {
            if (ann.IsWaiting()) {
                // REQUESTED and CANDIDATE_DELAYED must have a time in the future (they should have been converted
                // to COMPLETED/CANDIDATE_READY respectively).
                assert(ann.m_time > now);
            } else if (ann.IsSelectable()) {
                // CANDIDATE_READY and CANDIDATE_BEST cannot have a time in the future (they should have remained
                // CANDIDATE_DELAYED, or should have been converted back to it if time went backwards).
                assert(ann.m_time <= now);
            }
        }
    }